

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O0

bool xercesc_4_0::XMLChar1_0::isValidNCName(XMLCh *toCheck,XMLSize_t count)

{
  byte bVar1;
  XMLCh *pXVar2;
  XMLCh *endPtr;
  XMLCh *curCh;
  XMLSize_t count_local;
  XMLCh *toCheck_local;
  
  if ((count != 0) && (*toCheck != L':')) {
    bVar1 = (&fgCharCharsTable1_0)[(ushort)*toCheck] & 2;
    pXVar2 = toCheck + 1;
    while (bVar1 != 0) {
      if (toCheck + count <= pXVar2) {
        return true;
      }
      bVar1 = (&fgCharCharsTable1_0)[(ushort)*pXVar2] & 1;
      pXVar2 = pXVar2 + 1;
    }
  }
  return false;
}

Assistant:

bool XMLChar1_0::isValidNCName(const   XMLCh* const    toCheck
                               , const XMLSize_t       count)
{
    if (count == 0)
        return false;

    const XMLCh* curCh = toCheck;
    const XMLCh* endPtr = toCheck + count;
    if (*curCh== chColon || !(fgCharCharsTable1_0[*curCh++] & gFirstNameCharMask))
        return false;

    while (curCh < endPtr)
    {
        if (!(fgCharCharsTable1_0[*curCh++] & gNCNameCharMask))
            return false;
    }
    return true;
}